

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O1

LY_ERR lydjson_get_snode(lyd_json_ctx *lydctx,ly_bool is_attr,char *prefix,size_t prefix_len,
                        char *name,size_t name_len,lyd_node *parent,lysc_node **snode,
                        lysc_ext_instance **ext)

{
  uint uVar1;
  lysc_ext_instance *plVar2;
  lysc_node *plVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lysc_node *plVar6;
  char *pcVar7;
  LY_VECODE code;
  ly_ctx *plVar8;
  ulong uVar9;
  lysc_node **pplVar10;
  uint32_t options;
  
  uVar1 = lydctx->int_opts;
  *snode = (lysc_node *)0x0;
  *ext = (lysc_ext_instance *)0x0;
  if (prefix_len == 0) {
    if (parent == (lyd_node *)0x0) {
      if ((uVar1 & 0x10) == 0) {
        plVar8 = lydctx->jsonctx->ctx;
        uVar9 = (ulong)((int)name_len + (uint)(is_attr != '\0'));
        prefix = name + -(ulong)(is_attr != '\0');
        pcVar7 = "Top-level JSON object member \"%.*s\" must be namespace-qualified.";
        code = LYVE_SYNTAX_JSON;
        goto LAB_00136e7d;
      }
    }
    else if (parent->schema != (lysc_node *)0x0) {
      plVar5 = parent->schema->module;
      goto LAB_00136ded;
    }
    plVar5 = (lys_module *)0x0;
  }
  else {
    if (parent == (lyd_node *)0x0) {
      plVar5 = (lys_module *)lydctx->jsonctx;
    }
    else if (parent->schema == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar5 = parent->schema->module;
    }
    plVar5 = ly_ctx_get_module_implemented2(plVar5->ctx,prefix,prefix_len);
  }
LAB_00136ded:
  if (plVar5 == (lys_module *)0x0) {
    LVar4 = ly_nested_ext_schema
                      (parent,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                       name_len,snode,ext);
    if (LVar4 != LY_ENOT) {
      return LVar4;
    }
    if ((lydctx->parse_opts & 0x20000) == 0) {
      return LY_SUCCESS;
    }
    plVar8 = lydctx->jsonctx->ctx;
    pcVar7 = "No module named \"%.*s\" in the context.";
    code = LYVE_REFERENCE;
    uVar9 = prefix_len & 0xffffffff;
LAB_00136e7d:
    ly_vlog(plVar8,(char *)0x0,code,pcVar7,uVar9,prefix);
    return LY_EVALID;
  }
  options = (uVar1 & 4) << 2;
  if (parent == (lyd_node *)0x0) {
    if (lydctx->ext != (lysc_ext_instance *)0x0) {
      plVar6 = lysc_ext_find_node(lydctx->ext,plVar5,name,name_len,0,options);
      goto LAB_00136ed3;
    }
  }
  else if (parent->schema == (lysc_node *)0x0) {
    return LY_SUCCESS;
  }
  plVar6 = lyd_parser_node_schema(parent);
  plVar6 = lys_find_child(plVar6,plVar5,name,name_len,0,options);
LAB_00136ed3:
  *snode = plVar6;
  if (plVar6 != (lysc_node *)0x0) {
    LVar4 = lyd_parser_check_schema((lyd_ctx *)lydctx,plVar6);
    return LVar4;
  }
  LVar4 = ly_nested_ext_schema
                    (parent,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                     name_len,snode,ext);
  if (LVar4 == LY_ENOT) {
    if ((lydctx->parse_opts & 0x20000) != 0) {
      if (parent == (lyd_node *)0x0) {
        plVar2 = lydctx->ext;
        if (plVar2 == (lysc_ext_instance *)0x0) {
          plVar8 = lydctx->jsonctx->ctx;
          pcVar7 = "Node \"%.*s\" not found in the \"%s\" module.";
          plVar6 = (lysc_node *)plVar5->name;
        }
        else {
          plVar8 = lydctx->jsonctx->ctx;
          plVar3 = (lysc_node *)plVar2->def->name;
          if ((lysc_node *)plVar2->argument == (lysc_node *)0x0) {
            pcVar7 = "Node \"%.*s\" not found in the %s extension instance.";
            plVar6 = plVar3;
          }
          else {
            pcVar7 = "Node \"%.*s\" not found in the \"%s\" %s extension instance.";
            plVar6 = (lysc_node *)plVar2->argument;
            ext = (lysc_ext_instance **)plVar3;
          }
        }
      }
      else {
        plVar8 = lydctx->jsonctx->ctx;
        pplVar10 = &parent[1].schema;
        if (parent->schema != (lysc_node *)0x0) {
          pplVar10 = (lysc_node **)&parent->schema->name;
        }
        pcVar7 = "Node \"%.*s\" not found as a child of \"%s\" node.";
        plVar6 = *pplVar10;
      }
      ly_vlog(plVar8,(char *)0x0,LYVE_REFERENCE,pcVar7,name_len,name,plVar6,ext);
      return LY_EVALID;
    }
    return LY_SUCCESS;
  }
  return LVar4;
}

Assistant:

static LY_ERR
lydjson_get_snode(struct lyd_json_ctx *lydctx, ly_bool is_attr, const char *prefix, size_t prefix_len, const char *name,
        size_t name_len, struct lyd_node *parent, const struct lysc_node **snode, struct lysc_ext_instance **ext)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lys_module *mod = NULL;
    uint32_t getnext_opts = lydctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    *snode = NULL;
    *ext = NULL;

    /* get the element module, prefer parent context because of extensions */
    if (prefix_len) {
        mod = ly_ctx_get_module_implemented2(parent ? LYD_CTX(parent) : lydctx->jsonctx->ctx, prefix, prefix_len);
    } else if (parent) {
        if (parent->schema) {
            mod = parent->schema->module;
        }
    } else if (!(lydctx->int_opts & LYD_INTOPT_ANY)) {
        LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Top-level JSON object member \"%.*s\" must be namespace-qualified.",
                (int)(is_attr ? name_len + 1 : name_len), is_attr ? name - 1 : name);
        ret = LY_EVALID;
        goto cleanup;
    }
    if (!mod) {
        /* check for extension data */
        r = ly_nested_ext_schema(parent, NULL, prefix, prefix_len, LY_VALUE_JSON, NULL, name, name_len, snode, ext);
        if (r != LY_ENOT) {
            /* success or error */
            ret = r;
            goto cleanup;
        }

        /* unknown module */
        if (lydctx->parse_opts & LYD_PARSE_STRICT) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "No module named \"%.*s\" in the context.", (int)prefix_len, prefix);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* get the schema node */
    if (mod && (!parent || parent->schema)) {
        if (!parent && lydctx->ext) {
            *snode = lysc_ext_find_node(lydctx->ext, mod, name, name_len, 0, getnext_opts);
        } else {
            *snode = lys_find_child(lyd_parser_node_schema(parent), mod, name, name_len, 0, getnext_opts);
        }
        if (!*snode) {
            /* check for extension data */
            r = ly_nested_ext_schema(parent, NULL, prefix, prefix_len, LY_VALUE_JSON, NULL, name, name_len, snode, ext);
            if (r != LY_ENOT) {
                /* success or error */
                ret = r;
                goto cleanup;
            }

            /* unknown data node */
            if (lydctx->parse_opts & LYD_PARSE_STRICT) {
                if (parent) {
                    LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found as a child of \"%s\" node.",
                            (int)name_len, name, LYD_NAME(parent));
                } else if (lydctx->ext) {
                    if (lydctx->ext->argument) {
                        LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE,
                                "Node \"%.*s\" not found in the \"%s\" %s extension instance.",
                                (int)name_len, name, lydctx->ext->argument, lydctx->ext->def->name);
                    } else {
                        LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found in the %s extension instance.",
                                (int)name_len, name, lydctx->ext->def->name);
                    }
                } else {
                    LOGVAL(lydctx->jsonctx->ctx, LYVE_REFERENCE, "Node \"%.*s\" not found in the \"%s\" module.",
                            (int)name_len, name, mod->name);
                }
                ret = LY_EVALID;
                goto cleanup;
            }
        } else {
            /* check that schema node is valid and can be used */
            ret = lyd_parser_check_schema((struct lyd_ctx *)lydctx, *snode);
        }
    }

cleanup:
    return ret;
}